

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

int choosePlayerNumber(int minPlayers,int maxPlayers)

{
  ostream *poVar1;
  __type local_15;
  int local_14;
  int local_10;
  int playerChoice;
  int maxPlayers_local;
  int minPlayers_local;
  
  local_10 = maxPlayers;
  playerChoice = minPlayers;
  do {
    poVar1 = std::operator<<((ostream *)&std::cout,"please choose a number of players between ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,playerChoice);
    poVar1 = std::operator<<(poVar1," and ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    std::operator<<(poVar1," :\n");
    std::istream::operator>>((istream *)&std::cin,&local_14);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,0x200);
    local_15 = true;
    if ((playerChoice <= local_14) && (local_15 = true, local_14 <= local_10)) {
      local_15 = std::isnan<int>(local_14);
    }
  } while (local_15 != false);
  return local_14;
}

Assistant:

static int choosePlayerNumber(int minPlayers, int maxPlayers) {
    int playerChoice;
    do {
        cout << "please choose a number of players between " << minPlayers << " and " << maxPlayers << " :\n";
        cin >> playerChoice;
        cin.clear();
        cin.ignore(512, '\n');
    } while (playerChoice < minPlayers || playerChoice > maxPlayers || isnan(playerChoice));
    return int(playerChoice);
}